

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

void __thiscall clara::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  pointer pCVar1;
  size_type __n;
  Column *col;
  pointer column;
  iterator local_50;
  
  this->m_columns = &columns->m_columns;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(columns->m_columns).
               super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(columns->m_columns).
              super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x30;
  this->m_activeIterators = __n;
  std::vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,__n);
  pCVar1 = (this->m_columns->
           super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (column = (this->m_columns->
                super__Vector_base<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; column != pCVar1; column = column + 1) {
    Column::iterator::iterator(&local_50,column);
    std::
    vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>::
    emplace_back<clara::TextFlow::Column::iterator>(&this->m_iterators,&local_50);
  }
  return;
}

Assistant:

explicit iterator( Columns const& columns )
            :   m_columns( columns.m_columns ),
                m_activeIterators( m_columns.size() )
            {
                m_iterators.reserve( m_columns.size() );

                for( auto const& col : m_columns )
                    m_iterators.push_back( col.begin() );
            }